

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O1

void init_race_probs(void)

{
  long lVar1;
  level_map_conflict *plVar2;
  int iVar3;
  int *piVar4;
  void *p;
  void *p_00;
  void *p_01;
  void *pvVar5;
  level_conflict *plVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  player_race *ppVar12;
  ulong uVar13;
  long lVar14;
  level_conflict *local_50;
  level_conflict *local_40;
  level_conflict *local_38;
  
  race_prob = (int **)mem_zalloc((ulong)z_info->p_race_max << 3);
  if (z_info->p_race_max != 0) {
    uVar13 = 0;
    do {
      piVar4 = (int *)mem_zalloc((long)world->num_levels << 2);
      race_prob[uVar13] = piVar4;
      uVar13 = uVar13 + 1;
    } while (uVar13 < z_info->p_race_max);
  }
  p = mem_zalloc((long)world->num_levels << 3);
  p_00 = mem_zalloc((long)world->num_levels << 3);
  p_01 = mem_zalloc((long)world->num_levels << 3);
  uVar13 = (ulong)(uint)world->num_levels;
  if (0 < world->num_levels) {
    lVar14 = 0;
    do {
      pvVar5 = mem_zalloc((long)(int)uVar13 << 2);
      *(void **)((long)p + lVar14 * 8) = pvVar5;
      pvVar5 = mem_zalloc((long)world->num_levels << 2);
      *(void **)((long)p_00 + lVar14 * 8) = pvVar5;
      pvVar5 = mem_zalloc((long)world->num_levels << 2);
      *(void **)((long)p_01 + lVar14 * 8) = pvVar5;
      lVar14 = lVar14 + 1;
      uVar13 = (ulong)world->num_levels;
    } while (lVar14 < (long)uVar13);
  }
  if (0 < world->num_levels) {
    lVar14 = 0;
    do {
      plVar6 = world->levels;
      if (plVar6[lVar14].north == (char *)0x0) {
        local_50 = (level_conflict *)0x0;
      }
      else {
        local_50 = level_by_name(world,plVar6[lVar14].north);
      }
      if (plVar6[lVar14].east == (char *)0x0) {
        local_38 = (level_conflict *)0x0;
      }
      else {
        local_38 = level_by_name(world,plVar6[lVar14].east);
      }
      if (plVar6[lVar14].south == (char *)0x0) {
        local_40 = (level_conflict *)0x0;
      }
      else {
        local_40 = level_by_name(world,plVar6[lVar14].south);
      }
      if (plVar6[lVar14].west == (char *)0x0) {
        plVar6 = (level_conflict *)0x0;
      }
      else {
        plVar6 = level_by_name(world,plVar6[lVar14].west);
      }
      plVar2 = world;
      if (0 < world->num_levels) {
        lVar1 = *(long *)((long)p + lVar14 * 8);
        lVar8 = *(long *)((long)p_00 + lVar14 * 8);
        lVar10 = *(long *)((long)p_01 + lVar14 * 8);
        lVar9 = 0;
        do {
          *(undefined4 *)(lVar1 + lVar9 * 4) = 0;
          *(undefined4 *)(lVar8 + lVar9 * 4) = 0;
          *(undefined4 *)(lVar10 + lVar9 * 4) = 0;
          lVar9 = lVar9 + 1;
        } while (lVar9 < plVar2->num_levels);
      }
      if (local_50 != (level_conflict *)0x0) {
        *(undefined4 *)(*(long *)((long)p + lVar14 * 8) + (long)local_50->index * 4) = 1;
        *(undefined4 *)(*(long *)((long)p_01 + lVar14 * 8) + (long)local_50->index * 4) = 1;
      }
      if (local_38 != (level_conflict *)0x0) {
        *(undefined4 *)(*(long *)((long)p + lVar14 * 8) + (long)local_38->index * 4) = 1;
        *(undefined4 *)(*(long *)((long)p_01 + lVar14 * 8) + (long)local_38->index * 4) = 1;
      }
      if (local_40 != (level_conflict *)0x0) {
        *(undefined4 *)(*(long *)((long)p + lVar14 * 8) + (long)local_40->index * 4) = 1;
        *(undefined4 *)(*(long *)((long)p_01 + lVar14 * 8) + (long)local_40->index * 4) = 1;
      }
      if (plVar6 != (level_conflict *)0x0) {
        *(undefined4 *)(*(long *)((long)p + lVar14 * 8) + (long)plVar6->index * 4) = 1;
        *(undefined4 *)(*(long *)((long)p_01 + lVar14 * 8) + (long)plVar6->index * 4) = 1;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < world->num_levels);
  }
  plVar2 = world;
  iVar3 = 0;
  do {
    if (0 < plVar2->num_levels) {
      lVar14 = 0;
      do {
        if (0 < plVar2->num_levels) {
          lVar1 = *(long *)((long)p_00 + lVar14 * 8);
          lVar8 = 0;
          do {
            *(undefined4 *)(lVar1 + lVar8 * 4) = 0;
            if (0 < plVar2->num_levels) {
              lVar10 = *(long *)((long)p_01 + lVar14 * 8);
              lVar9 = 0;
              do {
                piVar4 = (int *)(lVar1 + lVar8 * 4);
                *piVar4 = *piVar4 + *(int *)(*(long *)((long)p_01 + lVar9 * 8) + lVar8 * 4) *
                                    *(int *)(lVar10 + lVar9 * 4);
                lVar9 = lVar9 + 1;
              } while (lVar9 < plVar2->num_levels);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < plVar2->num_levels);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < plVar2->num_levels);
    }
    if (0 < plVar2->num_levels) {
      lVar14 = 0;
      do {
        if (0 < plVar2->num_levels) {
          lVar1 = *(long *)((long)p_00 + lVar14 * 8);
          lVar8 = *(long *)((long)p_01 + lVar14 * 8);
          lVar10 = 0;
          do {
            *(undefined4 *)(lVar8 + lVar10 * 4) = *(undefined4 *)(lVar1 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 < plVar2->num_levels);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < plVar2->num_levels);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  if (0 < plVar2->num_levels) {
    lVar14 = 0;
    do {
      if (0 < plVar2->num_levels) {
        lVar1 = *(long *)((long)p_00 + lVar14 * 8);
        lVar8 = *(long *)((long)p_01 + lVar14 * 8);
        lVar10 = 0;
        do {
          *(undefined4 *)(lVar1 + lVar10 * 4) = 0;
          if (0 < plVar2->num_levels) {
            lVar9 = *(long *)((long)p_01 + lVar14 * 8);
            lVar11 = 0;
            do {
              piVar4 = (int *)(lVar1 + lVar10 * 4);
              *piVar4 = *piVar4 + *(int *)(*(long *)((long)p + lVar11 * 8) + lVar10 * 4) *
                                  *(int *)(lVar9 + lVar11 * 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 < plVar2->num_levels);
          }
          iVar3 = *(int *)(lVar8 + lVar10 * 4);
          if (*(int *)(lVar1 + lVar10 * 4) < iVar3) {
            *(int *)(lVar1 + lVar10 * 4) = iVar3;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < plVar2->num_levels);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < plVar2->num_levels);
  }
  if (0 < world->num_levels) {
    local_50 = (level_conflict *)0x0;
    do {
      if (races != (player_race *)0x0) {
        iVar3 = 0;
        ppVar12 = races;
        do {
          plVar2 = world;
          pcVar7 = strstr(world->name,"Dungeon");
          lVar14 = 1;
          if (pcVar7 == (char *)0x0) {
            plVar6 = level_by_name(plVar2,ppVar12->hometown);
            lVar14 = (long)plVar6->index;
          }
          iVar3 = iVar3 + 1 +
                  *(int *)(*(long *)((long)p_00 + (long)world->levels[lVar14].index * 8) +
                          (long)local_50 * 4);
          race_prob[ppVar12->ridx][(long)local_50] = iVar3;
          ppVar12 = ppVar12->next;
        } while (ppVar12 != (player_race *)0x0);
      }
      local_50 = (level_conflict *)((long)local_50 + 1);
    } while ((long)local_50 < (long)world->num_levels);
  }
  if (0 < world->num_levels) {
    lVar14 = 0;
    do {
      mem_free(*(void **)((long)p_01 + lVar14 * 8));
      mem_free(*(void **)((long)p + lVar14 * 8));
      mem_free(*(void **)((long)p_00 + lVar14 * 8));
      lVar14 = lVar14 + 1;
    } while (lVar14 < world->num_levels);
  }
  mem_free(p_01);
  mem_free(p);
  mem_free(p_00);
  return;
}

Assistant:

void init_race_probs(void)
{
	int i, j, k, n;
	int **adjacency, **lev_path, **temp_path;

	/* Make the array */
	race_prob = mem_zalloc(z_info->p_race_max * sizeof(int*));
	for (i = 0; i < z_info->p_race_max; i++) {
		race_prob[i] = mem_zalloc(world->num_levels * sizeof(int));
	}

	/* Prepare temporary adjacency arrays */
	adjacency = mem_zalloc(world->num_levels * sizeof(int*));
	lev_path = mem_zalloc(world->num_levels * sizeof(int*));
	temp_path = mem_zalloc(world->num_levels * sizeof(int*));
	for (i = 0; i < world->num_levels; i++) {
		adjacency[i] = mem_zalloc(world->num_levels * sizeof(int));
		lev_path[i] = mem_zalloc(world->num_levels * sizeof(int));
		temp_path[i] = mem_zalloc(world->num_levels * sizeof(int));
	}

	/* Make the adjacency matrix */
	for (i = 0; i < world->num_levels; i++) {
		/* Get the horizontally adjacent levels */
		struct level *lev = &world->levels[i];
		struct level *north = NULL;
		struct level *east = NULL;
		struct level *south = NULL;
		struct level *west = NULL;
		if (lev->north) north = level_by_name(world, lev->north);
		if (lev->east) east = level_by_name(world, lev->east);
		if (lev->south) south = level_by_name(world, lev->south);
		if (lev->west) west = level_by_name(world, lev->west);

		/* Initialise this row */
		for (k = 0; k < world->num_levels; k++) {
			adjacency[i][k] = 0;
			lev_path[i][k] = 0;
			temp_path[i][k] = 0;
		}

		/* Add 1s where there's an adjacent stage (not up or down) */
		if (north) {
			adjacency[i][north->index] = 1;
			temp_path[i][north->index] = 1;
		}
		if (east) {
			adjacency[i][east->index] = 1;
			temp_path[i][east->index] = 1;
		}
		if (south) {
			adjacency[i][south->index] = 1;
			temp_path[i][south->index] = 1;
		}
		if (west) {
			adjacency[i][west->index] = 1;
			temp_path[i][west->index] = 1;
		}
	}

	/* Power it up (squaring 3 times gives eighth power) */
	for (n = 0; n < 3; n++) {
		/* Square */
		for (i = 0; i < world->num_levels; i++) {
			for (j = 0; j < world->num_levels; j++) {
				lev_path[i][j] = 0;
				for (k = 0; k < world->num_levels; k++) {
					lev_path[i][j] += temp_path[i][k] * temp_path[k][j];
				}
			}
		}

		/* Copy it over for the next squaring or final multiply */
		for (i = 0; i < world->num_levels; i++) {
			for (j = 0; j < world->num_levels; j++) {
				temp_path[i][j] = lev_path[i][j];
			}
		}
	}

	/* Get the max of length 8 and length 9 paths */
	for (i = 0; i < world->num_levels; i++) {
		for (j = 0; j < world->num_levels; j++) {
			/* Multiply to get the length 9s */
			lev_path[i][j] = 0;
			for (k = 0; k < world->num_levels; k++) {
				lev_path[i][j] += temp_path[i][k] * adjacency[k][j];
			}

			/* Now replace by the length 8s if it's larger */
			if (lev_path[i][j] < temp_path[i][j]) {
				lev_path[i][j] = temp_path[i][j];
			}
		}
	}

	/* We now have the maximum of the number of paths of length 8 and the
	 * number of paths of length 9 (we need to try odd and even length paths,
	 * as using just one leads to anomalies) from any level to any other,
	 * which we will use as a basis for the racial probability table for
	 * racially based monsters in any given level.  For a level, we give
	 * every race a 1, then add the number of paths of length 8 from their
	 * hometown to that level.  We then turn every row entry into the
	 * cumulative total of the row to that point.  Whenever a racially based
	 * monster is called for, we will take a random integer less than the
	 * last entry of the row for that level, and proceed along the row,
	 * allocating the race corresponding to the position where we first
	 * exceed that integer.
	 */
	for (i = 0; i < world->num_levels; i++) {
		int prob = 0;
		struct player_race *p_race = races;
		while (p_race) {
			int hometown = 	strstr(world->name, "Dungeon") ? 1 :
				level_by_name(world, p_race->hometown)->index;
			/* Enter the cumulative probability */
			prob += 1 + lev_path[world->levels[hometown].index][i];
			race_prob[p_race->ridx][i] = prob;
			p_race = p_race->next;
		}
	}

	/* Free the temporary arrays */
	for (i = 0; i < world->num_levels; i++) {
		mem_free(temp_path[i]);
		mem_free(adjacency[i]);
		mem_free(lev_path[i]);
	}
	mem_free(temp_path);
	mem_free(adjacency);
	mem_free(lev_path);
}